

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::DictionaryFeatureType::ByteSizeLong(DictionaryFeatureType *this)

{
  KeyTypeCase KVar1;
  int iVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  DictionaryFeatureType *this_local;
  
  sStack_18 = 0;
  KVar1 = KeyType_case(this);
  if (KVar1 != KEYTYPE_NOT_SET) {
    if (KVar1 == kInt64KeyType) {
      sStack_18 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::Int64FeatureType>
                            ((this->KeyType_).int64keytype_);
      sStack_18 = sStack_18 + 1;
    }
    else if (KVar1 == kStringKeyType) {
      sStack_18 = google::protobuf::internal::WireFormatLite::
                  MessageSizeNoVirtual<CoreML::Specification::StringFeatureType>
                            ((this->KeyType_).stringkeytype_);
      sStack_18 = sStack_18 + 1;
    }
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t DictionaryFeatureType::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.DictionaryFeatureType)
  size_t total_size = 0;

  switch (KeyType_case()) {
    // .CoreML.Specification.Int64FeatureType int64KeyType = 1;
    case kInt64KeyType: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *KeyType_.int64keytype_);
      break;
    }
    // .CoreML.Specification.StringFeatureType stringKeyType = 2;
    case kStringKeyType: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *KeyType_.stringkeytype_);
      break;
    }
    case KEYTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}